

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreakOperator.cpp
# Opt level: O0

LBDOperator * lts2::CreateFreakOperator(int M)

{
  LBDOperator *this;
  ostream *poVar1;
  FreakOperator *out;
  int M_local;
  
  this = (LBDOperator *)operator_new(0x98);
  FreakOperator::FreakOperator((FreakOperator *)this,M);
  if (this == (LBDOperator *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"CreateFreakOperator");
    poVar1 = std::operator<<(poVar1,"\t");
    std::operator<<(poVar1,"Something when wrong :-(");
  }
  return this;
}

Assistant:

lts2::LBDOperator *lts2::CreateFreakOperator(int M)
{
  lts2::FreakOperator *out = new lts2::FreakOperator(M);
  if (!out)
  {
    std::cerr << __FUNCTION__ << "\t" << "Something when wrong :-(";
  }
  return out;
}